

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O1

int encoder_append_type(ndn_encoder_t *encoder,uint32_t type)

{
  uint uVar1;
  uint8_t uVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = encoder->offset;
  uVar3 = encoder->output_max_size - uVar1;
  if (type < 0xfd && encoder->output_max_size != uVar1) {
    iVar4 = 1;
  }
  else {
    uVar2 = (uint8_t)(type >> 8);
    if (uVar3 < 3 || 0xffff < type) {
      if (uVar3 < 5) {
        return -0xe;
      }
      encoder->output_value[uVar1] = 0xfe;
      encoder->output_value[encoder->offset + 1] = (uint8_t)(type >> 0x18);
      encoder->output_value[encoder->offset + 2] = (uint8_t)(type >> 0x10);
      encoder->output_value[encoder->offset + 3] = uVar2;
      uVar1 = encoder->offset + 4;
      iVar4 = 5;
    }
    else {
      encoder->output_value[uVar1] = 0xfd;
      encoder->output_value[encoder->offset + 1] = uVar2;
      uVar1 = encoder->offset + 2;
      iVar4 = 3;
    }
  }
  encoder->output_value[uVar1] = (uint8_t)type;
  encoder->offset = encoder->offset + iVar4;
  return 0;
}

Assistant:

static inline int
encoder_append_type(ndn_encoder_t* encoder, uint32_t type)
{
  return encoder_append_var(encoder, type);
}